

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6258.c
# Opt level: O0

void okim6258_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  DEV_SMPL *pDVar1;
  DEV_SMPL *pDVar2;
  short sVar3;
  int local_50;
  int local_4c;
  ushort local_46;
  INT16 sample;
  int nibble;
  UINT8 nibble_shift;
  UINT32 i;
  DEV_SMPL *bufR;
  DEV_SMPL *bufL;
  okim6258_state *chip;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  pDVar1 = *outputs;
  pDVar2 = outputs[1];
  if (((*(byte *)((long)param + 8) & 2) == 0) || (*(char *)((long)param + 0x38) != '\0')) {
    for (nibble = 0; (uint)nibble < samples; nibble = nibble + 1) {
      pDVar1[(uint)nibble] = 0;
      pDVar2[(uint)nibble] = 0;
    }
  }
  else {
    sample._1_1_ = *(byte *)((long)param + 0x17);
    for (nibble = 0; (uint)nibble < samples; nibble = nibble + 1) {
      if (sample._1_1_ == 0) {
        if (*(char *)((long)param + 0x2a) == '\0') {
          *(undefined1 *)((long)param + 0x16) =
               *(undefined1 *)
                ((long)param + (long)((int)(uint)*(byte *)((long)param + 0x29) >> 4) + 0x20);
          *(char *)((long)param + 0x29) = *(char *)((long)param + 0x29) + '\x10';
          *(byte *)((long)param + 0x29) = *(byte *)((long)param + 0x29) & 0x7f;
          if ((int)(uint)*(byte *)((long)param + 0x29) >> 4 == (*(byte *)((long)param + 0x29) & 0xf)
             ) {
            *(char *)((long)param + 0x2a) = *(char *)((long)param + 0x2a) + '\x01';
          }
        }
        else if (*(byte *)((long)param + 0x2a) < 0x80) {
          *(char *)((long)param + 0x2a) = *(char *)((long)param + 0x2a) + '\x01';
        }
      }
      if (*(byte *)((long)param + 0x2a) < 2) {
        local_46 = clock_adpcm((okim6258_state *)param,
                               (byte)((int)(uint)*(byte *)((long)param + 0x16) >>
                                     (sample._1_1_ & 0x1f)) & 0xf);
        *(ushort *)((long)param + 0x2c) = local_46;
      }
      else {
        if (2 < *(byte *)((long)param + 0x2a)) {
          *(char *)((long)param + 0x2a) = *(char *)((long)param + 0x2a) + -1;
          *(short *)((long)param + 0x1c) =
               (short)((long)(*(short *)((long)param + 0x1c) * 0xf) / 0x10);
          *(undefined2 *)((long)param + 0x2c) = *(undefined2 *)((long)param + 0x1c);
        }
        local_46 = *(ushort *)((long)param + 0x2c);
      }
      sample._1_1_ = sample._1_1_ ^ 4;
      sVar3 = (local_46 & *(ushort *)((long)param + 0x1a)) << 4;
      if ((*(byte *)((long)param + 0x2b) & 2) == 0) {
        local_4c = (int)sVar3;
      }
      else {
        local_4c = 0;
      }
      pDVar1[(uint)nibble] = local_4c;
      if ((*(byte *)((long)param + 0x2b) & 1) == 0) {
        local_50 = (int)sVar3;
      }
      else {
        local_50 = 0;
      }
      pDVar2[(uint)nibble] = local_50;
    }
    *(byte *)((long)param + 0x17) = sample._1_1_;
  }
  return;
}

Assistant:

static void okim6258_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	okim6258_state *chip = (okim6258_state *)param;
	DEV_SMPL *bufL = outputs[0];
	DEV_SMPL *bufR = outputs[1];
	UINT32 i;

	if ((chip->status & STATUS_PLAYING) && ! chip->Muted)
	{
		UINT8 nibble_shift = chip->nibble_shift;

		for (i = 0; i < samples; i++)
		{
			/* Compute the new amplitude and update the current step */
			int nibble;
			INT16 sample;
			
			if (! nibble_shift)
			{
				// 1st nibble - get data
				if (! chip->data_empty)
				{
					chip->data_in = chip->data_buf[chip->data_buf_pos >> 4];
					chip->data_buf_pos += 0x10;
					chip->data_buf_pos &= 0x7F;
					if ((chip->data_buf_pos >> 4) == (chip->data_buf_pos & 0x0F))
						chip->data_empty ++;
				}
				else
				{
					//chip->data_in = chip->data_in_last;
					if (chip->data_empty < 0x80)
						chip->data_empty ++;
				}
			}
			nibble = (chip->data_in >> nibble_shift) & 0xf;

			/* Output to the buffer */
			//sample = clock_adpcm(chip, nibble);
			if (chip->data_empty < 0x02)
			{
				sample = clock_adpcm(chip, nibble);
				chip->last_smpl = sample;
			}
			else
			{
				// Valley Bell: data_empty behaviour (loosely) ported from XM6
				if (chip->data_empty >= 0x02 + 0x01)
				{
					chip->data_empty -= 0x01;
					chip->signal = chip->signal * 15 / 16;
					chip->last_smpl = chip->signal;
				}
				sample = chip->last_smpl;
			}

			nibble_shift ^= 4;

			sample &= chip->output_mask;	// emulate DAC precision
			sample <<= 4;	// scale up to 16 bit
			bufL[i] = (chip->pan & 0x02) ? 0 : sample;
			bufR[i] = (chip->pan & 0x01) ? 0 : sample;
		}

		/* Update the parameters */
		chip->nibble_shift = nibble_shift;
	}
	else
	{
		/* Fill with 0 */
		for (i = 0; i < samples; i++)
		{
			bufL[i] = 0;
			bufR[i] = 0;
		}
	}
}